

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O3

QByteArray * __thiscall
QHttpNetworkReply::readAny(QByteArray *__return_storage_ptr__,QHttpNetworkReply *this)

{
  long lVar1;
  size_t __nbytes;
  void *in_RDX;
  void *extraout_RDX;
  
  lVar1 = *(long *)(this + 8);
  __nbytes = *(size_t *)(lVar1 + 0x1a0);
  if (__nbytes == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if (((__nbytes == 1) && (*(char *)(lVar1 + 0x1bb) != '\0')) && (*(int *)(lVar1 + 0xd0) != 4)) {
      __nbytes = (size_t)*(uint *)(*(long *)(lVar1 + 0x168) + 4);
      QHttpNetworkConnectionPrivate::readMoreLater
                (*(QHttpNetworkConnectionPrivate **)(*(long *)(lVar1 + 0x170) + 8),
                 (QHttpNetworkReply *)this);
      in_RDX = extraout_RDX;
    }
    QByteDataBuffer::read
              ((QByteDataBuffer *)__return_storage_ptr__,(int)lVar1 + 400,in_RDX,__nbytes);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QHttpNetworkReply::readAny()
{
    Q_D(QHttpNetworkReply);
    if (d->responseData.bufferCount() == 0)
        return QByteArray();

    // we'll take the last buffer, so schedule another read from http
    if (d->downstreamLimited && d->responseData.bufferCount() == 1 && !isFinished())
        d->connection->d_func()->readMoreLater(this);
    return d->responseData.read();
}